

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall van_kampen::Graph::printSelf(Graph *this,ostream *os,graphOutputFormat fmt)

{
  _Map_pointer ppNVar1;
  _Map_pointer ppNVar2;
  _Elt_pointer pNVar3;
  __node_base_ptr p_Var4;
  _Hash_node_base *p_Var5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  Node *pNVar12;
  __node_base_ptr p_Var13;
  int iVar14;
  size_t i;
  ulong uVar15;
  
  if (fmt == WOLFRAM_NOTEBOOK) {
    pcVar11 = "Graph[Rule @@@ {";
    lVar8 = 0x10;
LAB_00139b01:
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,lVar8);
  }
  else if (fmt == DOT) {
    pcVar11 = "digraph G {\nrankdir=LR;\nlayout=neato;\n";
    lVar8 = 0x26;
    goto LAB_00139b01;
  }
  uVar15 = 0;
  while( true ) {
    ppNVar1 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppNVar2 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    pNVar3 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    iVar14 = (int)uVar15;
    if (((long)(this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last - (long)pNVar3 >> 3) *
        -0x2c8590b21642c859 +
        ((long)(this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x2c8590b21642c859 +
        (((long)ppNVar1 - (long)ppNVar2 >> 3) + -1 + (ulong)(ppNVar1 == (_Map_pointer)0x0)) * 2 <=
        uVar15) break;
    uVar6 = (this->removedNodes_)._M_h._M_bucket_count;
    uVar9 = (ulong)(long)iVar14 % uVar6;
    p_Var4 = (this->removedNodes_)._M_h._M_buckets[uVar9];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var4, p_Var13 = p_Var4->_M_nxt, *(int *)&p_Var4->_M_nxt[1]._M_nxt != iVar14)) {
      while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var5[1]._M_nxt % uVar6 != uVar9) ||
           (p_Var7 = p_Var13, p_Var13 = p_Var5, *(int *)&p_Var5[1]._M_nxt == iVar14))
        goto LAB_00139bbd;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00139bbd:
    if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
      uVar6 = ((long)pNVar3 -
               (long)(this->nodes_).
                     super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + uVar15;
      if (uVar6 < 2) {
        pNVar12 = pNVar3 + uVar15;
      }
      else {
        pNVar12 = ppNVar2[uVar6 >> 1] + uVar6 + (uVar6 >> 1) * -2;
      }
      Node::printSelf(pNVar12,os,fmt);
    }
    uVar15 = uVar15 + 1;
  }
  uVar15 = 0;
  while( true ) {
    ppNVar1 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node;
    ppNVar2 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    pNVar3 = (this->nodes_).super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar6 = ((long)(this->nodes_).
                   super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last - (long)pNVar3 >> 3) *
            -0x2c8590b21642c859 +
            ((long)(this->nodes_).
                   super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->nodes_).
                   super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 3) * -0x2c8590b21642c859 +
            (((long)ppNVar1 - (long)ppNVar2 >> 3) + -1 + (ulong)(ppNVar1 == (_Map_pointer)0x0)) * 2;
    if (uVar6 <= uVar15) break;
    iVar14 = (int)uVar15;
    uVar9 = (this->removedNodes_)._M_h._M_bucket_count;
    uVar10 = (ulong)(long)iVar14 % uVar9;
    p_Var4 = (this->removedNodes_)._M_h._M_buckets[uVar10];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var4 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var4, p_Var13 = p_Var4->_M_nxt, *(int *)&p_Var4->_M_nxt[1]._M_nxt != iVar14)) {
      while (p_Var5 = p_Var13->_M_nxt, p_Var5 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var5[1]._M_nxt % uVar9 != uVar10) ||
           (p_Var7 = p_Var13, p_Var13 = p_Var5, *(int *)&p_Var5[1]._M_nxt == iVar14))
        goto LAB_00139cd6;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00139cd6:
    if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
      uVar9 = ((long)pNVar3 -
               (long)(this->nodes_).
                     super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>._M_impl.
                     super__Deque_impl_data._M_start._M_first >> 3) * -0x2c8590b21642c859 + uVar15;
      if (uVar9 < 2) {
        pNVar12 = pNVar3 + uVar15;
      }
      else {
        pNVar12 = ppNVar2[uVar9 >> 1] + uVar9 + (uVar9 >> 1) * -2;
      }
      Node::printTransitions(pNVar12,os,fmt,uVar15 == uVar6 - 1);
    }
    uVar15 = uVar15 + 1;
  }
  if (fmt == DOT) {
    pcVar11 = "}\n";
    lVar8 = 2;
  }
  else {
    if (fmt != WOLFRAM_NOTEBOOK) goto LAB_00139d7c;
    pcVar11 = "}, GraphLayout -> \"PlanarEmbedding\"]\n";
    lVar8 = 0x25;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar11,lVar8);
LAB_00139d7c:
  std::ostream::flush();
  return;
}

Assistant:

void Graph::printSelf(std::ostream &os, graphOutputFormat fmt) const
{
    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "digraph G {\n"
              "rankdir=LR;\n"
              "layout=neato;\n";
        break;
    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "Graph[Rule @@@ {";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }

    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printSelf(os, fmt);
    }
    for (std::size_t i = 0; i < nodes_.size(); ++i)
    {
        if (removedNodes_.find(i) != removedNodes_.end())
        {
            continue;
        }
        nodes_[i].printTransitions(os, fmt, i == nodes_.size() - 1);
    }

    switch (fmt)
    {
    case graphOutputFormat::DOT:
        os << "}\n";
        break;

    case graphOutputFormat::WOLFRAM_NOTEBOOK:
        os << "}, GraphLayout -> \"PlanarEmbedding\"]\n";
        break;

    case graphOutputFormat::TXT_EDGES:
        break;

    default:
        break;
    }
    os.flush();
}